

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_wrapper.cpp
# Opt level: O2

bool __thiscall pstore::command_line::word_wrapper::operator==(word_wrapper *this,word_wrapper *rhs)

{
  __type_conflict1 _Var1;
  
  _Var1 = std::operator==(this->text_,rhs->text_);
  if (((_Var1) && (this->max_width_ == rhs->max_width_)) && (this->start_pos_ == rhs->start_pos_)) {
    _Var1 = std::operator==(&this->substr_,&rhs->substr_);
    return _Var1;
  }
  return false;
}

Assistant:

bool word_wrapper::operator== (word_wrapper const & rhs) const {
                return text_ == rhs.text_ && max_width_ == rhs.max_width_ &&
                       start_pos_ == rhs.start_pos_ && substr_ == rhs.substr_;
            }